

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O1

sexp_conflict
sexp_get_file_descriptor_flags_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0)

{
  sexp psVar1;
  int iVar2;
  sexp_conflict psVar3;
  
  if (((ulong)arg0 & 3) == 0) {
    if (2 < arg0->tag - 0x10) goto LAB_00103ab4;
  }
  else if (((ulong)arg0 & 1) == 0) {
LAB_00103ab4:
    psVar3 = (sexp_conflict)sexp_xtype_exception(ctx,self,"not a port or file descriptor");
    return psVar3;
  }
  if (((ulong)arg0 & 3) == 0) {
    if (arg0->tag - 0x10 < 2) {
      psVar1 = (arg0->value).type.getters;
      if (psVar1 == (sexp)0x0) {
        psVar1 = (arg0->value).type.slots;
        iVar2 = -1;
        if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
          iVar2 = (int)(psVar1->value).fileno.fd;
        }
      }
      else {
        iVar2 = fileno((FILE *)psVar1);
      }
      goto LAB_00103ad6;
    }
    if (arg0->tag == 0x12) {
      iVar2 = (int)(arg0->value).fileno.fd;
      goto LAB_00103ad6;
    }
  }
  iVar2 = (int)((long)arg0 >> 1);
LAB_00103ad6:
  iVar2 = fcntl(iVar2,1);
  psVar3 = (sexp_conflict)sexp_make_integer(ctx,(long)iVar2,(long)(iVar2 >> 0x1f));
  return psVar3;
}

Assistant:

sexp sexp_get_file_descriptor_flags_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0) {
  sexp res;
  if (! (sexp_portp(arg0) || sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_xtype_exception(ctx, self, "not a port or file descriptor",arg0);
  res = sexp_make_integer(ctx, fcntl((sexp_portp(arg0) ? sexp_port_fileno(arg0) : sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)), F_GETFD));
  return res;
}